

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_utils_basis.h
# Opt level: O2

uint __thiscall
ktx::OptionsEncodeBasis<false>::captureCodecOption<unsigned_int>
          (OptionsEncodeBasis<false> *this,ParseResult *args,char *name)

{
  uint uVar1;
  OptionValue *this_00;
  uint *puVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args_00;
  string_view fmt;
  string local_68;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,name,(allocator<char> *)&local_40);
  this_00 = cxxopts::ParseResult::operator[](args,&local_68);
  puVar2 = cxxopts::OptionValue::as<unsigned_int>(this_00);
  uVar1 = *puVar2;
  std::__cxx11::string::~string((string *)&local_68);
  args_00.field_1.args_ = in_R9.args_;
  args_00.desc_ = (unsigned_long_long)&local_68;
  fmt.size_ = 0x2c;
  fmt.data_ = (char *)0x8;
  local_68._M_dataplus._M_p = name;
  local_68.field_2._M_allocated_capacity = (ulong)uVar1;
  ::fmt::v10::vformat_abi_cxx11_(&local_40,(v10 *)" --{} {}",fmt,args_00);
  std::__cxx11::string::append((string *)&this->codecOptions);
  std::__cxx11::string::~string((string *)&local_40);
  return uVar1;
}

Assistant:

T captureCodecOption(cxxopts::ParseResult& args, const char* name) {
        const T value = args[name].as<T>();
        codecOptions += fmt::format(" --{} {}", name, value);
        return value;
    }